

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConverterRegistry.cpp
# Opt level: O2

ConverterFunction
SoapySDR::ConverterRegistry::getFunction
          (string *sourceFormat,string *targetFormat,FunctionPriority *priority)

{
  size_type sVar1;
  mapped_type *pmVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  size_type sVar5;
  mapped_type *pp_Var6;
  runtime_error *prVar7;
  string sStack_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  lateLoadDefaultConverters();
  sVar1 = std::map<$5159af05$>::count(&formatConverters_abi_cxx11_,sourceFormat);
  if (sVar1 == 0) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_c8,
                   "ConverterRegistry::getFunction() conversion source not registered; sourceFormat="
                   ,sourceFormat);
    std::operator+(&local_a8,&local_c8,", targetFormat=");
    std::operator+(&local_88,&local_a8,targetFormat);
    std::operator+(&local_68,&local_88,", priority=");
    std::__cxx11::to_string(&sStack_e8,*priority);
    std::operator+(&local_48,&local_68,&sStack_e8);
    std::runtime_error::runtime_error(prVar7,(string *)&local_48);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pmVar2 = std::map<$5159af05$>::operator[](&formatConverters_abi_cxx11_,sourceFormat);
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>_>_>_>
          ::count(pmVar2,targetFormat);
  if (sVar3 != 0) {
    pmVar2 = std::map<$5159af05$>::operator[](&formatConverters_abi_cxx11_,sourceFormat);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>_>_>_>
             ::operator[](pmVar2,targetFormat);
    sVar5 = std::
            map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>
            ::count(pmVar4,priority);
    if (sVar5 != 0) {
      pmVar2 = std::map<$5159af05$>::operator[](&formatConverters_abi_cxx11_,sourceFormat);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>_>_>_>
               ::operator[](pmVar2,targetFormat);
      pp_Var6 = std::
                map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>
                ::operator[](pmVar4,priority);
      return (ConverterFunction)*pp_Var6;
    }
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_c8,
                   "ConverterRegistry::getFunction() conversion priority not registered; sourceFormat="
                   ,sourceFormat);
    std::operator+(&local_a8,&local_c8,", targetFormat=");
    std::operator+(&local_88,&local_a8,targetFormat);
    std::operator+(&local_68,&local_88,", priority=");
    std::__cxx11::to_string(&sStack_e8,*priority);
    std::operator+(&local_48,&local_68,&sStack_e8);
    std::runtime_error::runtime_error(prVar7,(string *)&local_48);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_c8,
                 "ConverterRegistry::getFunction() conversion target not registered; sourceFormat=",
                 sourceFormat);
  std::operator+(&local_a8,&local_c8,", targetFormat=");
  std::operator+(&local_88,&local_a8,targetFormat);
  std::operator+(&local_68,&local_88,", priority=");
  std::__cxx11::to_string(&sStack_e8,*priority);
  std::operator+(&local_48,&local_68,&sStack_e8);
  std::runtime_error::runtime_error(prVar7,(string *)&local_48);
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

SoapySDR::ConverterRegistry::ConverterFunction SoapySDR::ConverterRegistry::getFunction(const std::string &sourceFormat, const std::string &targetFormat, const FunctionPriority &priority)
{
  lateLoadDefaultConverters();

  if (formatConverters.count(sourceFormat) == 0)
    {
      throw std::runtime_error("ConverterRegistry::getFunction() conversion source not registered; "
                               "sourceFormat="+sourceFormat+", targetFormat="+targetFormat+", priority="+std::to_string(priority));
    }

  if (formatConverters[sourceFormat].count(targetFormat) == 0)
    {
      throw std::runtime_error("ConverterRegistry::getFunction() conversion target not registered; "
                               "sourceFormat="+sourceFormat+", targetFormat="+targetFormat+", priority="+std::to_string(priority));
    }

  if (formatConverters[sourceFormat][targetFormat].count(priority) == 0)
    {
      throw std::runtime_error("ConverterRegistry::getFunction() conversion priority not registered; "
                               "sourceFormat="+sourceFormat+", targetFormat="+targetFormat+", priority="+std::to_string(priority));
    }

  return formatConverters[sourceFormat][targetFormat][priority];
}